

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O1

LIndex __thiscall
JPolComponent_VectorImplementation::GetIndex(JPolComponent_VectorImplementation *this)

{
  uint uVar1;
  value_type_conflict2 *__val;
  LIndex LVar2;
  Interface_ProblemToPolicyDiscretePure *pIVar3;
  ulong uVar4;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> indexVec;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> individualIndices;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrIndPol;
  allocator_type local_99;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_98;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_78;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_58;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_40;
  
  pIVar3 = this->_m_PTPDP;
  if (pIVar3 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar3 = (this->_m_PTPDPshared).px;
  }
  uVar1 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&local_40,(long)(int)uVar1,(allocator_type *)&local_58);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&local_58,(long)(int)uVar1,&local_99);
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      pIVar3 = this->_m_PTPDP;
      if (pIVar3 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
        pIVar3 = (this->_m_PTPDPshared).px;
      }
      LVar2 = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                        (pIVar3,(Index)uVar4,this->_m_idc,
                         *(size_t *)
                          &(this->_m_indivPols_PolicyPureVector).
                           super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4]->field_0x8);
      local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = LVar2;
      LVar2 = PolicyPureVector::GetIndex
                        ((this->_m_indivPols_PolicyPureVector).
                         super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = LVar2;
      uVar4 = uVar4 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar4);
  }
  LVar2 = *local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (int)uVar1) {
    uVar4 = 1;
    do {
      *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_start *
           local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4 - 1];
      local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start[1] =
           local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4];
      *local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start = LVar2;
      local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start[1] =
           local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4];
      LVar2 = IndexTools::IndividualToJointIndices(&local_98,&local_78);
      uVar4 = uVar4 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar4);
  }
  if (local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (LIndex *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (LIndex *)0x0) {
    operator_delete(local_98.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return LVar2;
}

Assistant:

LIndex JPolComponent_VectorImplementation::GetIndex() const
{
    int nrAgents=GetInterfacePTPDiscretePure()->GetNrAgents();

    vector<LIndex> nrElems(2);
    nrElems[0]=1;
    nrElems[1]=1;

    vector<LIndex> indexVec(2);

    vector<LIndex> nrIndPol(nrAgents);
    vector<LIndex> individualIndices(nrAgents);
    for(int k=0;k<nrAgents;++k)
    {
        nrIndPol[k]=GetInterfacePTPDiscretePure()->GetNrPolicies(k, _m_idc,
                                            _m_indivPols_PolicyPureVector[k]->
                                            GetDepth());
        individualIndices[k]=_m_indivPols_PolicyPureVector[k]->GetIndex();
    }

    LIndex i=individualIndices[0];

    for(int k=1;k<nrAgents;++k)
    {
        
        nrElems[0]*=nrIndPol[k-1];
        nrElems[1]=nrIndPol[k];

        indexVec[0]=i;
        indexVec[1]=individualIndices[k];
        i=IndexTools::IndividualToJointIndices(indexVec,nrElems);
#if 0
        cout << SoftPrintVector(nrIndPol) << " "
             << SoftPrintVector(individualIndices)
             << " " << k << " "
             << SoftPrintVector(indexVec) << " "
             << SoftPrintVector(nrElems) << endl;
#endif
    }
    return(i);
}